

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 numericType(Mem *pMem)

{
  Mem *pMem_local;
  
  if ((pMem->flags & 0x2c) == 0) {
    if ((pMem->flags & 0x12) == 0) {
      pMem_local._6_2_ = 0;
    }
    else {
      pMem_local._6_2_ = computeNumericType(pMem);
    }
  }
  else {
    pMem_local._6_2_ = pMem->flags & 0x2c;
  }
  return pMem_local._6_2_;
}

Assistant:

static u16 numericType(Mem *pMem){
  if( pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal) ){
    testcase( pMem->flags & MEM_Int );
    testcase( pMem->flags & MEM_Real );
    testcase( pMem->flags & MEM_IntReal );
    return pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal);
  }
  if( pMem->flags & (MEM_Str|MEM_Blob) ){
    testcase( pMem->flags & MEM_Str );
    testcase( pMem->flags & MEM_Blob );
    return computeNumericType(pMem);
  }
  return 0;
}